

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O0

void polymul_internal::composer<double,_2,_8,_10>::compose0(double *dst,double *p,double *c)

{
  int local_24;
  int i;
  double *c_local;
  double *p_local;
  double *dst_local;
  
  composer<double,_2,_7,_10>::compose0(dst,p,c + 1);
  for (local_24 = 0x24; local_24 < 0x2d; local_24 = local_24 + 1) {
    dst[local_24] = 0.0;
  }
  taylor_inplace_multiplier<double,_2,_8,_8,_0>::mul(dst,p);
  *dst = *c;
  return;
}

Assistant:

static void compose0(numtype dst[], const numtype p[], const numtype c[]) {
    composer<numtype, Nvar, Ndeg - 1, Ndegp>::compose0(dst, p, c + 1);
    // Zero top of dst
    for (int i = polylen<Nvar, Ndeg - 1>::len; i < polylen<Nvar, Ndeg>::len; i++)
      dst[i] = 0;
    // We now have R in dst, multiply by p and add c[0]
    taylor_inplace_multiplier < numtype, Nvar, Ndeg,
        Ndeg<Ndegp ? Ndeg : Ndegp, 0>::mul(dst, p);
    dst[0] = c[0];
  }